

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiPlatformMonitor *pIVar1;
  ImGuiContext *pIVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 new_size;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  ImVec2 IVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_30;
  
  pIVar2 = GImGui;
  fVar7 = ImGuiWindow::TitleBarHeight(window);
  fVar8 = ImGuiWindow::MenuBarHeight(window);
  fVar19 = (window->WindowPadding).x;
  fVar19 = fVar19 + fVar19;
  fVar17 = (window->WindowPadding).y;
  fVar17 = fVar17 + fVar17;
  fVar9 = size_contents->x + fVar19;
  fVar21 = size_contents->y + fVar17 + fVar8 + fVar7;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    IVar15 = (pIVar2->Style).WindowMinSize;
    if ((window->Flags & 0x14000000U) != 0) {
      fVar20 = IVar15.x;
      if (4.0 <= IVar15.x) {
        fVar20 = 4.0;
      }
      fVar18 = IVar15.y;
      if (4.0 <= IVar15.y) {
        fVar18 = 4.0;
      }
      IVar15.y = fVar18;
      IVar15.x = fVar20;
    }
    if (window->ViewportOwned == false) {
      fVar20 = (window->Viewport->super_ImGuiViewport).Size.x;
      fVar18 = (window->Viewport->super_ImGuiViewport).Size.y;
    }
    else {
      fVar20 = 3.4028235e+38;
      fVar18 = 3.4028235e+38;
    }
    lVar4 = (long)window->ViewportAllowPlatformMonitorExtend;
    if ((-1 < lVar4) &&
       (window->ViewportAllowPlatformMonitorExtend < (pIVar2->PlatformIO).Monitors.Size)) {
      pIVar1 = (pIVar2->PlatformIO).Monitors.Data;
      fVar20 = pIVar1[lVar4].WorkSize.x;
      fVar18 = pIVar1[lVar4].WorkSize.y;
    }
    fVar14 = (pIVar2->Style).DisplaySafeAreaPadding.x;
    fVar16 = (pIVar2->Style).DisplaySafeAreaPadding.y;
    fVar20 = fVar20 - (fVar14 + fVar14);
    fVar18 = fVar18 - (fVar16 + fVar16);
    fVar14 = IVar15.x;
    uVar6 = -(uint)(fVar20 <= fVar14);
    fVar16 = IVar15.y;
    fVar20 = (float)(uVar6 & (uint)fVar14 | ~uVar6 & (uint)fVar20);
    uVar6 = -(uint)(fVar18 <= fVar16);
    fVar18 = (float)(uVar6 & (uint)fVar16 | ~uVar6 & (uint)fVar18);
    if (fVar21 <= fVar18) {
      fVar18 = fVar21;
    }
    fVar21 = (float)(-(uint)(fVar21 < fVar16) & (uint)fVar16 |
                    ~-(uint)(fVar21 < fVar16) & (uint)fVar18);
    uVar6 = -(uint)(fVar20 < fVar9);
    new_size.x = (float)(-(uint)(fVar9 < fVar14) & (uint)fVar14 |
                        ~-(uint)(fVar9 < fVar14) &
                        (~uVar6 & (uint)(fVar9 + 0.0) | uVar6 & (uint)fVar20));
    new_size.y = fVar21;
    IVar10 = CalcWindowSizeAfterConstraint(window,new_size);
    if ((size_contents->x <= IVar10.x - fVar19) || (bVar3 = 1, (window->Flags & 0x808U) != 0x800)) {
      bVar3 = *(byte *)((long)&window->Flags + 1) >> 7;
    }
    if ((size_contents->y <= (IVar10.y - fVar17) - (fVar8 + fVar7)) ||
       (bVar5 = 1, (window->Flags & 8) != 0)) {
      bVar5 = (*(byte *)((long)&window->Flags + 1) & 0x40) >> 6;
    }
    auVar12._4_4_ = fVar21;
    auVar12._0_4_ = new_size.x;
    auVar12._8_8_ = uStack_30;
    auVar11._8_4_ = (undefined4)uStack_30;
    auVar11._12_4_ = (undefined4)((ulong)uStack_30 >> 0x20);
    if (bVar3 != 0) {
      auVar11._4_4_ = (pIVar2->Style).ScrollbarSize + 0.0;
      auVar11._0_4_ = new_size.x;
      auVar12 = auVar11;
    }
    IVar10 = auVar12._0_8_;
    if (bVar5 != 0) {
      auVar13._4_12_ = auVar12._4_12_;
      auVar13._0_4_ = auVar12._0_4_ + (pIVar2->Style).ScrollbarSize;
      IVar10 = auVar13._0_8_;
    }
  }
  else {
    IVar10.y = fVar21;
    IVar10.x = fVar9 + 0.0;
  }
  return IVar10;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = window->Viewport->Size;
        if (window->ViewportOwned)
            avail_size = ImVec2(FLT_MAX, FLT_MAX);
        const int monitor_idx = window->ViewportAllowPlatformMonitorExtend;
        if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
            avail_size = g.PlatformIO.Monitors[monitor_idx].WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - g.Style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}